

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cuboctahedron.hpp
# Opt level: O0

void __thiscall
OpenMD::TruncatedCube::TruncatedCube(TruncatedCube *this,string *lattice,int cells,int planes)

{
  string *in_RSI;
  undefined8 *in_RDI;
  int in_stack_000000e0;
  int in_stack_000000e4;
  string *in_stack_000000e8;
  Cuboctahedron *in_stack_000000f0;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  Cuboctahedron::Cuboctahedron
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e4,in_stack_000000e0);
  std::__cxx11::string::~string(local_38);
  *in_RDI = &PTR__TruncatedCube_00349bd8;
  return;
}

Assistant:

TruncatedCube(std::string lattice, int cells, int planes) :
        Cuboctahedron(lattice, cells, planes) {}